

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scaler.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::Scaler::SerializeWithCachedSizes(Scaler *this,CodedOutputStream *output)

{
  int iVar1;
  RepeatedField<double> *pRVar2;
  double *pdVar3;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  Scaler *this_local;
  
  iVar1 = shiftvalue_size(this);
  if (0 < iVar1) {
    google::protobuf::internal::WireFormatLite::WriteTag(1,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_shiftvalue_cached_byte_size_);
    pRVar2 = shiftvalue(this);
    pdVar3 = google::protobuf::RepeatedField<double>::data(pRVar2);
    iVar1 = shiftvalue_size(this);
    google::protobuf::internal::WireFormatLite::WriteDoubleArray(pdVar3,iVar1,output);
  }
  iVar1 = scalevalue_size(this);
  if (0 < iVar1) {
    google::protobuf::internal::WireFormatLite::WriteTag(2,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_scalevalue_cached_byte_size_);
    pRVar2 = scalevalue(this);
    pdVar3 = google::protobuf::RepeatedField<double>::data(pRVar2);
    iVar1 = scalevalue_size(this);
    google::protobuf::internal::WireFormatLite::WriteDoubleArray(pdVar3,iVar1,output);
  }
  return;
}

Assistant:

void Scaler::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.Scaler)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated double shiftValue = 1;
  if (this->shiftvalue_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_shiftvalue_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteDoubleArray(
      this->shiftvalue().data(), this->shiftvalue_size(), output);
  }

  // repeated double scaleValue = 2;
  if (this->scalevalue_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(2, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_scalevalue_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteDoubleArray(
      this->scalevalue().data(), this->scalevalue_size(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.Scaler)
}